

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<QBenchmarkMeasurerBase::Measurement>::data(QList<QBenchmarkMeasurerBase::Measurement> *this)

{
  QArrayDataPointer<QBenchmarkMeasurerBase::Measurement> *this_00;
  Measurement *pMVar1;
  QArrayDataPointer<QBenchmarkMeasurerBase::Measurement> *in_RDI;
  
  detach((QList<QBenchmarkMeasurerBase::Measurement> *)0x1295ac);
  this_00 = (QArrayDataPointer<QBenchmarkMeasurerBase::Measurement> *)
            QArrayDataPointer<QBenchmarkMeasurerBase::Measurement>::operator->(in_RDI);
  pMVar1 = QArrayDataPointer<QBenchmarkMeasurerBase::Measurement>::data(this_00);
  return pMVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }